

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_encryptor.h
# Opt level: O1

void __thiscall cppcms::sessions::impl::hmac_factory::~hmac_factory(hmac_factory *this)

{
  pointer pcVar1;
  
  (this->super_encryptor_factory)._vptr_encryptor_factory = (_func_int **)&PTR_get_0028c520;
  crypto::key::~key(&this->key_);
  pcVar1 = (this->algo_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->algo_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~hmac_factory() {}